

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ccb0f7::ResizeRealtimeTest::~ResizeRealtimeTest(ResizeRealtimeTest *this)

{
  undefined8 *in_RDI;
  vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  *unaff_retaddr;
  
  *in_RDI = &PTR__ResizeRealtimeTest_01f85140;
  in_RDI[2] = &PTR__ResizeRealtimeTest_01f85198;
  in_RDI[3] = &PTR__ResizeRealtimeTest_01f851b8;
  std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>::
  ~vector(unaff_retaddr);
  libaom_test::EncoderTest::~EncoderTest((EncoderTest *)0x8dcdcb);
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,_int,_int>::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,_int,_int> *)0x8dcdd5);
  return;
}

Assistant:

~ResizeRealtimeTest() override = default;